

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_fread(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  io_private *pDev_00;
  char *pcVar2;
  jx9_int64 jVar3;
  uint local_4c;
  int nLen;
  void *pBuf;
  jx9_int64 nRead;
  io_private *pDev;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
    jx9_result_bool(pCtx,0);
  }
  else {
    pDev_00 = (io_private *)jx9_value_to_resource(*apArg);
    if ((pDev_00 == (io_private *)0x0) || (pDev_00->iMagic != 0xfeac14)) {
      jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
      jx9_result_bool(pCtx,0);
    }
    else if (pDev_00->pStream == (jx9_io_stream *)0x0) {
      pcVar2 = jx9_function_name(pCtx);
      jx9_context_throw_error_format
                (pCtx,2,
                 "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                 ,pcVar2,"null_stream");
      jx9_result_bool(pCtx,0);
    }
    else {
      local_4c = 0x1000;
      if ((1 < nArg) && (local_4c = jx9_value_to_int(apArg[1]), (int)local_4c < 1)) {
        local_4c = 0x1000;
      }
      pcVar2 = (char *)jx9_context_alloc_chunk(pCtx,local_4c,0,0);
      if (pcVar2 == (char *)0x0) {
        jx9_context_throw_error(pCtx,1,"JX9 is running out of memory");
        jx9_result_bool(pCtx,0);
      }
      else {
        jVar3 = StreamRead(pDev_00,pcVar2,(long)(int)local_4c);
        if (jVar3 < 1) {
          jx9_result_bool(pCtx,0);
        }
        else {
          jx9_result_string(pCtx,pcVar2,(int)jVar3);
        }
        jx9_context_free_chunk(pCtx,pcVar2);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_fread(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	jx9_int64 nRead;
	void *pBuf;
	int nLen;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
        nLen = 4096;
	if( nArg > 1 ){
 	  nLen = jx9_value_to_int(apArg[1]);
	  if( nLen < 1 ){
		/* Invalid length, set a default length */
		nLen = 4096;
	  }
        }
	/* Allocate enough buffer */
	pBuf = jx9_context_alloc_chunk(pCtx, (unsigned int)nLen, FALSE, FALSE);
	if( pBuf == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");			
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	nRead = StreamRead(pDev, pBuf, (jx9_int64)nLen);
	if( nRead < 1 ){
		/* Nothing read, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Make a copy of the data just read */
		jx9_result_string(pCtx, (const char *)pBuf, (int)nRead);
	}
	/* Release the buffer */
	jx9_context_free_chunk(pCtx, pBuf);
	return JX9_OK;	
}